

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void PlaySoundObject(int no,int mode)

{
  BOOL looping;
  AudioBackend_Sound *sound;
  
  if (audio_backend_initialised) {
    sound = lpSECONDARYBUFFER[no];
    if (sound != (AudioBackend_Sound *)0x0) {
      if (mode == -1) {
        looping = true;
      }
      else {
        if (mode != 1) {
          if (mode != 0) {
            return;
          }
          AudioBackend_StopSound(sound);
          return;
        }
        AudioBackend_StopSound(sound);
        AudioBackend_RewindSound(lpSECONDARYBUFFER[no]);
        sound = lpSECONDARYBUFFER[no];
        looping = false;
      }
      AudioBackend_PlaySound(sound,looping);
      return;
    }
  }
  return;
}

Assistant:

void PlaySoundObject(int no, int mode)
{
	if (!audio_backend_initialised)
		return;

	if (lpSECONDARYBUFFER[no] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
				break;

			case 1:	// 再生 (Playback)
				AudioBackend_StopSound(lpSECONDARYBUFFER[no]);
				AudioBackend_RewindSound(lpSECONDARYBUFFER[no]);
				AudioBackend_PlaySound(lpSECONDARYBUFFER[no], FALSE);
				break;

			case -1:// ループ再生 (Loop playback)
				AudioBackend_PlaySound(lpSECONDARYBUFFER[no], TRUE);
				break;
		}
	}
}